

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  unkbyte10 Var29;
  int iVar30;
  int iVar31;
  void *pvVar32;
  void *pvVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  undefined1 (*pauVar39) [16];
  uint uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  undefined8 *puVar44;
  undefined1 (*pauVar45) [16];
  int q;
  int iVar46;
  int q_1;
  bool bVar47;
  int iVar48;
  short sVar52;
  int iVar51;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined4 uVar56;
  short sVar64;
  short sVar65;
  int iVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar59 [12];
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  undefined4 uVar73;
  short sVar80;
  int iVar81;
  short sVar97;
  short sVar98;
  short sVar99;
  undefined1 auVar82 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar96 [16];
  int iVar100;
  int iVar111;
  int iVar112;
  int iVar113;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar110 [16];
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar117 [16];
  short sVar123;
  short sVar131;
  undefined1 auVar125 [12];
  short sVar132;
  undefined1 auVar126 [12];
  undefined1 auVar133 [12];
  short sVar146;
  undefined1 auVar134 [12];
  short sVar145;
  undefined1 auVar135 [16];
  int iVar147;
  undefined1 auVar149 [12];
  short sVar160;
  undefined1 auVar150 [16];
  short sVar161;
  char cVar174;
  short sVar175;
  char cVar177;
  short sVar178;
  char cVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  undefined1 auVar164 [16];
  char cVar173;
  char cVar176;
  char cVar179;
  short sVar185;
  undefined1 auVar166 [16];
  short sVar186;
  undefined1 auVar193 [16];
  short sVar196;
  undefined1 auVar194 [12];
  undefined1 auVar197 [16];
  undefined1 local_1b8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Mat local_120;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Mat tmp;
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined6 uVar57;
  undefined8 uVar58;
  undefined1 auVar60 [12];
  undefined1 auVar62 [16];
  undefined1 auVar61 [14];
  undefined1 auVar63 [16];
  undefined6 uVar74;
  undefined1 auVar76 [12];
  undefined8 uVar75;
  undefined1 auVar77 [12];
  undefined1 auVar79 [16];
  undefined1 auVar78 [14];
  undefined1 auVar83 [16];
  undefined1 auVar92 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar94 [16];
  undefined1 auVar88 [16];
  undefined1 auVar95 [16];
  undefined1 auVar89 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar124 [12];
  undefined1 auVar127 [14];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar128 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar151 [16];
  undefined1 auVar148 [12];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar162 [12];
  undefined1 auVar163 [14];
  undefined1 auVar165 [16];
  undefined4 uVar187;
  undefined6 uVar188;
  undefined8 uVar189;
  undefined1 auVar190 [12];
  undefined1 auVar191 [14];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  
  uVar1 = bottom_im2col->w;
  lVar38 = (long)(int)uVar1;
  iVar37 = bottom_im2col->h;
  iVar72 = bottom_im2col->c;
  iVar36 = top_blob->c;
  tmp.cstep = 0;
  tmp._16_12_ = SUB1612((undefined1  [16])0x0,4);
  tmp._0_12_ = SUB1612((undefined1  [16])0x0,0);
  tmp.refcount._4_4_ = 0;
  tmp._48_12_ = SUB1612((undefined1  [16])0x0,4);
  tmp._32_12_ = SUB1612((undefined1  [16])0x0,0);
  tmp.w = 0;
  uVar40 = (uVar1 & 1) + (uVar1 >> 1);
  if (lVar38 < 2) {
    uVar40 = uVar1;
  }
  Mat::create(&tmp,iVar37 << (1 < lVar38),iVar72,uVar40,8,8,opt->workspace_allocator);
  iVar34 = 0;
  if (0 < iVar37) {
    iVar34 = iVar37;
  }
  iVar41 = 0;
  if (0 < iVar72) {
    iVar41 = iVar72;
  }
  local_1b8._0_8_ = 0;
  uVar43 = (ulong)(uint)((int)uVar1 >> 1);
  if ((int)uVar1 >> 1 < 1) {
    uVar43 = 0;
  }
  for (uVar42 = 0; uVar42 != uVar43; uVar42 = uVar42 + 1) {
    Mat::channel(&local_120,&tmp,(int)uVar42);
    pauVar39 = (undefined1 (*) [16])local_120.data;
    Mat::~Mat(&local_120);
    for (iVar46 = 0; iVar46 != iVar41; iVar46 = iVar46 + 1) {
      Mat::channel(&local_120,bottom_im2col,iVar46);
      puVar44 = (undefined8 *)((undefined1 *)local_120.data + local_1b8._0_8_);
      Mat::~Mat(&local_120);
      iVar35 = iVar34;
      while (bVar47 = iVar35 != 0, iVar35 = iVar35 + -1, bVar47) {
        uVar58 = puVar44[1];
        *(undefined8 *)*pauVar39 = *puVar44;
        *(undefined8 *)(*pauVar39 + 8) = uVar58;
        pauVar39 = pauVar39 + 1;
        puVar44 = puVar44 + lVar38;
      }
    }
    local_1b8._0_8_ = local_1b8._0_8_ + 0x10;
  }
  uVar43 = (ulong)(int)(uVar1 & 0xfffffffe);
  local_1b8._0_8_ = uVar43 * 8;
  for (; (long)uVar43 < lVar38; uVar43 = uVar43 + 1) {
    uVar42 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 | uVar43 & 0xffffffff;
    Mat::channel(&local_120,&tmp,(int)((long)uVar42 % 2) + (int)((long)uVar42 / 2));
    pauVar39 = (undefined1 (*) [16])local_120.data;
    Mat::~Mat(&local_120);
    for (iVar46 = 0; iVar46 != iVar41; iVar46 = iVar46 + 1) {
      Mat::channel(&local_120,bottom_im2col,iVar46);
      puVar44 = (undefined8 *)((undefined1 *)local_120.data + local_1b8._0_8_);
      Mat::~Mat(&local_120);
      iVar35 = iVar34;
      while (bVar47 = iVar35 != 0, iVar35 = iVar35 + -1, bVar47) {
        *(undefined8 *)*pauVar39 = *puVar44;
        pauVar39 = (undefined1 (*) [16])(*pauVar39 + 8);
        puVar44 = puVar44 + lVar38;
      }
    }
    local_1b8._0_8_ = local_1b8._0_8_ + 8;
  }
  iVar41 = 0;
  iVar34 = iVar72 * iVar37;
  if (iVar72 * iVar37 < 1) {
    iVar34 = iVar41;
  }
  if (iVar36 < 1) {
    iVar36 = 0;
  }
  for (; iVar41 != iVar36; iVar41 = iVar41 + 1) {
    Mat::channel(&local_120,top_blob,iVar41);
    pauVar39 = (undefined1 (*) [16])local_120.data;
    Mat::~Mat(&local_120);
    uVar43 = 0;
    while( true ) {
      if ((int)uVar1 <= (int)((uint)uVar43 | 1)) break;
      Mat::channel(&local_120,&tmp,(int)(uVar43 >> 1));
      pvVar32 = local_120.data;
      Mat::~Mat(&local_120);
      Mat::channel(&local_120,kernel,iVar41);
      pvVar33 = local_120.data;
      Mat::~Mat(&local_120);
      iVar55 = 0;
      iVar66 = 0;
      iVar69 = 0;
      iVar70 = 0;
      lVar38 = 0;
      iVar72 = 0;
      iVar46 = 0;
      iVar35 = 0;
      iVar81 = 0;
      iVar100 = 0;
      iVar111 = 0;
      iVar112 = 0;
      iVar113 = 0;
      auVar164 = (undefined1  [16])0x0;
      local_198 = (undefined1  [16])0x0;
      local_1b8 = (undefined1  [16])0x0;
      local_188 = (undefined1  [16])0x0;
      auVar117 = (undefined1  [16])0x0;
      iVar37 = iVar34;
      while (auVar63 = auVar117, bVar47 = iVar37 != 0, iVar37 = iVar37 + -1, iVar51 = auVar164._4_4_
            , iVar53 = auVar164._8_4_, iVar54 = auVar164._12_4_, bVar47) {
        auVar90 = *(undefined1 (*) [16])((undefined1 *)pvVar32 + lVar38);
        auVar89._0_14_ = auVar90._0_14_;
        auVar89[0xe] = auVar90[7];
        auVar89[0xf] = -(auVar90[7] < '\0');
        auVar88._14_2_ = auVar89._14_2_;
        auVar88._0_13_ = auVar90._0_13_;
        auVar88[0xd] = -(auVar90[6] < '\0');
        auVar87._13_3_ = auVar88._13_3_;
        auVar87._0_12_ = auVar90._0_12_;
        auVar87[0xc] = auVar90[6];
        auVar86._12_4_ = auVar87._12_4_;
        auVar86._0_11_ = auVar90._0_11_;
        auVar86[0xb] = -(auVar90[5] < '\0');
        auVar85._11_5_ = auVar86._11_5_;
        auVar85._0_10_ = auVar90._0_10_;
        auVar85[10] = auVar90[5];
        auVar84._10_6_ = auVar85._10_6_;
        auVar84._0_9_ = auVar90._0_9_;
        auVar84[9] = -(auVar90[4] < '\0');
        auVar83._9_7_ = auVar84._9_7_;
        auVar83._0_8_ = auVar90._0_8_;
        auVar83[8] = auVar90[4];
        Var4 = CONCAT91(CONCAT81(auVar83._8_8_,-(auVar90[3] < '\0')),auVar90[3]);
        auVar3._2_10_ = Var4;
        auVar3[1] = -(auVar90[2] < '\0');
        auVar3[0] = auVar90[2];
        auVar2._2_12_ = auVar3;
        auVar2[1] = -(auVar90[1] < '\0');
        auVar2[0] = auVar90[1];
        auVar82._0_2_ = CONCAT11(-(auVar90[0] < '\0'),auVar90[0]);
        auVar82._2_14_ = auVar2;
        sVar161 = CONCAT11(-(auVar90[8] < '\0'),auVar90[8]);
        uVar73 = CONCAT13(-(auVar90[9] < '\0'),CONCAT12(auVar90[9],sVar161));
        uVar74 = CONCAT15(-(auVar90[10] < '\0'),CONCAT14(auVar90[10],uVar73));
        uVar75 = CONCAT17(-(auVar90[0xb] < '\0'),CONCAT16(auVar90[0xb],uVar74));
        auVar162._0_10_ = CONCAT19(-(auVar90[0xc] < '\0'),CONCAT18(auVar90[0xc],uVar75));
        auVar162[10] = auVar90[0xd];
        auVar162[0xb] = -(auVar90[0xd] < '\0');
        auVar163[0xc] = auVar90[0xe];
        auVar163._0_12_ = auVar162;
        auVar163[0xd] = -(auVar90[0xe] < '\0');
        auVar165[0xe] = auVar90[0xf];
        auVar165._0_14_ = auVar163;
        auVar165[0xf] = -(auVar90[0xf] < '\0');
        auVar90 = *(undefined1 (*) [16])((undefined1 *)pvVar33 + lVar38 * 2);
        auVar193 = *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pvVar33 + 0x10) + lVar38 * 2)
        ;
        auVar157._0_14_ = auVar90._0_14_;
        auVar157[0xe] = auVar90[7];
        auVar157[0xf] = -(auVar90[7] < '\0');
        auVar156._14_2_ = auVar157._14_2_;
        auVar156._0_13_ = auVar90._0_13_;
        auVar156[0xd] = -(auVar90[6] < '\0');
        auVar155._13_3_ = auVar156._13_3_;
        auVar155._0_12_ = auVar90._0_12_;
        auVar155[0xc] = auVar90[6];
        auVar154._12_4_ = auVar155._12_4_;
        auVar154._0_11_ = auVar90._0_11_;
        auVar154[0xb] = -(auVar90[5] < '\0');
        auVar153._11_5_ = auVar154._11_5_;
        auVar153._0_10_ = auVar90._0_10_;
        auVar153[10] = auVar90[5];
        auVar152._10_6_ = auVar153._10_6_;
        auVar152._0_9_ = auVar90._0_9_;
        auVar152[9] = -(auVar90[4] < '\0');
        auVar151._9_7_ = auVar152._9_7_;
        auVar151._0_8_ = auVar90._0_8_;
        auVar151[8] = auVar90[4];
        Var7 = CONCAT91(CONCAT81(auVar151._8_8_,-(auVar90[3] < '\0')),auVar90[3]);
        auVar6._2_10_ = Var7;
        auVar6[1] = -(auVar90[2] < '\0');
        auVar6[0] = auVar90[2];
        auVar5._2_12_ = auVar6;
        auVar5[1] = -(auVar90[1] < '\0');
        auVar5[0] = auVar90[1];
        auVar150._0_2_ = CONCAT11(-(auVar90[0] < '\0'),auVar90[0]);
        auVar150._2_14_ = auVar5;
        sVar123 = CONCAT11(-(auVar90[8] < '\0'),auVar90[8]);
        uVar56 = CONCAT13(-(auVar90[9] < '\0'),CONCAT12(auVar90[9],sVar123));
        uVar57 = CONCAT15(-(auVar90[10] < '\0'),CONCAT14(auVar90[10],uVar56));
        uVar58 = CONCAT17(-(auVar90[0xb] < '\0'),CONCAT16(auVar90[0xb],uVar57));
        auVar124._0_10_ = CONCAT19(-(auVar90[0xc] < '\0'),CONCAT18(auVar90[0xc],uVar58));
        auVar124[10] = auVar90[0xd];
        auVar124[0xb] = -(auVar90[0xd] < '\0');
        auVar127[0xc] = auVar90[0xe];
        auVar127._0_12_ = auVar124;
        auVar127[0xd] = -(auVar90[0xe] < '\0');
        auVar128[0xe] = auVar90[0xf];
        auVar128._0_14_ = auVar127;
        auVar128[0xf] = -(auVar90[0xf] < '\0');
        auVar142._0_14_ = auVar193._0_14_;
        auVar142[0xe] = auVar193[7];
        auVar142[0xf] = -(auVar193[7] < '\0');
        auVar141._14_2_ = auVar142._14_2_;
        auVar141._0_13_ = auVar193._0_13_;
        auVar141[0xd] = -(auVar193[6] < '\0');
        auVar140._13_3_ = auVar141._13_3_;
        auVar140._0_12_ = auVar193._0_12_;
        auVar140[0xc] = auVar193[6];
        auVar139._12_4_ = auVar140._12_4_;
        auVar139._0_11_ = auVar193._0_11_;
        auVar139[0xb] = -(auVar193[5] < '\0');
        auVar138._11_5_ = auVar139._11_5_;
        auVar138._0_10_ = auVar193._0_10_;
        auVar138[10] = auVar193[5];
        auVar137._10_6_ = auVar138._10_6_;
        auVar137._0_9_ = auVar193._0_9_;
        auVar137[9] = -(auVar193[4] < '\0');
        auVar136._9_7_ = auVar137._9_7_;
        auVar136._0_8_ = auVar193._0_8_;
        auVar136[8] = auVar193[4];
        Var10 = CONCAT91(CONCAT81(auVar136._8_8_,-(auVar193[3] < '\0')),auVar193[3]);
        auVar9._2_10_ = Var10;
        auVar9[1] = -(auVar193[2] < '\0');
        auVar9[0] = auVar193[2];
        auVar8._2_12_ = auVar9;
        auVar8[1] = -(auVar193[1] < '\0');
        auVar8[0] = auVar193[1];
        auVar135._0_2_ = CONCAT11(-(auVar193[0] < '\0'),auVar193[0]);
        auVar135._2_14_ = auVar8;
        sVar186 = CONCAT11(-(auVar193[8] < '\0'),auVar193[8]);
        uVar187 = CONCAT13(-(auVar193[9] < '\0'),CONCAT12(auVar193[9],sVar186));
        uVar188 = CONCAT15(-(auVar193[10] < '\0'),CONCAT14(auVar193[10],uVar187));
        uVar189 = CONCAT17(-(auVar193[0xb] < '\0'),CONCAT16(auVar193[0xb],uVar188));
        auVar190._0_10_ = CONCAT19(-(auVar193[0xc] < '\0'),CONCAT18(auVar193[0xc],uVar189));
        auVar190[10] = auVar193[0xd];
        auVar190[0xb] = -(auVar193[0xd] < '\0');
        auVar191[0xc] = auVar193[0xe];
        auVar191._0_12_ = auVar190;
        auVar191[0xd] = -(auVar193[0xe] < '\0');
        auVar192[0xe] = auVar193[0xf];
        auVar192._0_14_ = auVar191;
        auVar192[0xf] = -(auVar193[0xf] < '\0');
        sVar132 = auVar2._0_2_;
        sVar146 = auVar3._0_2_;
        sVar160 = (short)Var7;
        sVar121 = (short)Var4;
        sVar80 = sVar160 * sVar121;
        sVar97 = auVar83._8_2_;
        sVar98 = auVar85._10_2_;
        sVar99 = auVar87._12_2_;
        local_c8 = pmulhw(auVar82,auVar150);
        sVar64 = (short)((uint)uVar56 >> 0x10);
        sVar65 = (short)((uint6)uVar57 >> 0x20);
        sVar131 = (short)((ulong)uVar58 >> 0x30);
        sVar67 = sVar131 * sVar121;
        sVar68 = (short)((unkuint10)auVar124._0_10_ >> 0x40);
        local_d8 = pmulhw(auVar82,auVar128);
        sVar145 = (short)Var10;
        sVar52 = sVar145 * sVar121;
        auVar197 = pmulhw(auVar82,auVar135);
        sVar119 = (short)((uint)uVar187 >> 0x10);
        sVar120 = (short)((uint6)uVar188 >> 0x20);
        sVar196 = (short)((ulong)uVar189 >> 0x30);
        sVar121 = sVar196 * sVar121;
        sVar122 = (short)((unkuint10)auVar190._0_10_ >> 0x40);
        auVar90 = pmulhw(auVar82,auVar192);
        local_98 = pmulhw(auVar165,auVar150);
        sVar175 = (short)((uint)uVar73 >> 0x10);
        sVar178 = (short)((uint6)uVar74 >> 0x20);
        sVar181 = (short)((ulong)uVar75 >> 0x30);
        sVar160 = sVar160 * sVar181;
        sVar182 = (short)((unkuint10)auVar162._0_10_ >> 0x40);
        sVar183 = auVar162._10_2_;
        sVar184 = auVar163._12_2_;
        sVar185 = auVar165._14_2_;
        local_a8 = pmulhw(auVar165,auVar128);
        sVar131 = sVar131 * sVar181;
        local_b8 = pmulhw(auVar165,auVar135);
        sVar145 = sVar145 * sVar181;
        sVar196 = sVar196 * sVar181;
        auVar193 = pmulhw(auVar192,auVar165);
        iVar48 = CONCAT22(local_c8._6_2_,sVar80);
        Var4 = CONCAT64(CONCAT42(iVar48,local_c8._4_2_),CONCAT22(auVar6._0_2_ * sVar146,sVar80));
        auVar11._4_8_ = (long)((unkuint10)Var4 >> 0x10);
        auVar11._2_2_ = local_c8._2_2_;
        auVar11._0_2_ = auVar5._0_2_ * sVar132;
        iVar147 = CONCAT22(local_d8._6_2_,sVar67);
        Var7 = CONCAT64(CONCAT42(iVar147,local_d8._4_2_),CONCAT22(sVar65 * sVar146,sVar67));
        auVar12._4_8_ = (long)((unkuint10)Var7 >> 0x10);
        auVar12._2_2_ = local_d8._2_2_;
        auVar12._0_2_ = sVar64 * sVar132;
        iVar30 = CONCAT22(auVar197._6_2_,sVar52);
        Var10 = CONCAT64(CONCAT42(iVar30,auVar197._4_2_),CONCAT22(auVar9._0_2_ * sVar146,sVar52));
        auVar13._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar13._2_2_ = auVar197._2_2_;
        auVar13._0_2_ = auVar8._0_2_ * sVar132;
        iVar31 = CONCAT22(auVar90._6_2_,sVar121);
        Var29 = CONCAT64(CONCAT42(iVar31,auVar90._4_2_),CONCAT22(sVar120 * sVar146,sVar121));
        auVar14._4_8_ = (long)((unkuint10)Var29 >> 0x10);
        auVar14._2_2_ = auVar90._2_2_;
        auVar14._0_2_ = sVar119 * sVar132;
        iVar71 = CONCAT22(local_c8._8_2_,auVar151._8_2_ * sVar97);
        auVar76._0_8_ = CONCAT26(local_c8._10_2_,CONCAT24(auVar153._10_2_ * sVar98,iVar71));
        auVar76._8_2_ = auVar155._12_2_ * sVar99;
        auVar76._10_2_ = local_c8._12_2_;
        auVar79._12_2_ = auVar156._14_2_ * auVar88._14_2_;
        auVar79._0_12_ = auVar76;
        auVar79._14_2_ = local_c8._14_2_;
        local_188._4_4_ = local_188._4_4_ + auVar11._0_4_ + (int)((ulong)auVar76._0_8_ >> 0x20);
        local_188._0_4_ =
             local_188._0_4_ + CONCAT22(local_c8._0_2_,auVar150._0_2_ * auVar82._0_2_) + iVar71;
        local_188._8_4_ = local_188._8_4_ + (int)((unkuint10)Var4 >> 0x10) + auVar76._8_4_;
        local_188._12_4_ = local_188._12_4_ + iVar48 + auVar79._12_4_;
        iVar48 = CONCAT22(local_d8._8_2_,sVar68 * sVar97);
        auVar59._0_8_ = CONCAT26(local_d8._10_2_,CONCAT24(auVar124._10_2_ * sVar98,iVar48));
        auVar59._8_2_ = auVar127._12_2_ * sVar99;
        auVar59._10_2_ = local_d8._12_2_;
        auVar62._12_2_ = auVar128._14_2_ * auVar88._14_2_;
        auVar62._0_12_ = auVar59;
        auVar62._14_2_ = local_d8._14_2_;
        local_1b8._4_4_ = local_1b8._4_4_ + auVar12._0_4_ + (int)((ulong)auVar59._0_8_ >> 0x20);
        local_1b8._0_4_ =
             local_1b8._0_4_ + CONCAT22(local_d8._0_2_,sVar123 * auVar82._0_2_) + iVar48;
        local_1b8._8_4_ = local_1b8._8_4_ + (int)((unkuint10)Var7 >> 0x10) + auVar59._8_4_;
        local_1b8._12_4_ = local_1b8._12_4_ + iVar147 + auVar62._12_4_;
        iVar48 = CONCAT22(auVar197._8_2_,auVar136._8_2_ * sVar97);
        auVar49._0_8_ = CONCAT26(auVar197._10_2_,CONCAT24(auVar138._10_2_ * sVar98,iVar48));
        auVar49._8_2_ = auVar140._12_2_ * sVar99;
        auVar49._10_2_ = auVar197._12_2_;
        auVar50._12_2_ = auVar141._14_2_ * auVar88._14_2_;
        auVar50._0_12_ = auVar49;
        auVar50._14_2_ = auVar197._14_2_;
        local_198._4_4_ = local_198._4_4_ + auVar13._0_4_ + (int)((ulong)auVar49._0_8_ >> 0x20);
        local_198._0_4_ =
             local_198._0_4_ + CONCAT22(auVar197._0_2_,auVar135._0_2_ * auVar82._0_2_) + iVar48;
        local_198._8_4_ = local_198._8_4_ + (int)((unkuint10)Var10 >> 0x10) + auVar49._8_4_;
        local_198._12_4_ = local_198._12_4_ + iVar30 + auVar50._12_4_;
        iVar48 = CONCAT22(auVar90._8_2_,sVar122 * sVar97);
        auVar114._0_8_ = CONCAT26(auVar90._10_2_,CONCAT24(auVar190._10_2_ * sVar98,iVar48));
        auVar114._8_2_ = auVar191._12_2_ * sVar99;
        auVar114._10_2_ = auVar90._12_2_;
        auVar116._12_2_ = auVar192._14_2_ * auVar88._14_2_;
        auVar116._0_12_ = auVar114;
        auVar116._14_2_ = auVar90._14_2_;
        auVar164._0_4_ = auVar164._0_4_ + CONCAT22(auVar90._0_2_,sVar186 * auVar82._0_2_) + iVar48;
        auVar164._4_4_ = iVar51 + auVar14._0_4_ + (int)((ulong)auVar114._0_8_ >> 0x20);
        auVar164._8_4_ = iVar53 + (int)((unkuint10)Var29 >> 0x10) + auVar114._8_4_;
        auVar164._12_4_ = iVar54 + iVar31 + auVar116._12_4_;
        iVar51 = CONCAT22(local_98._6_2_,sVar160);
        Var4 = CONCAT64(CONCAT42(iVar51,local_98._4_2_),CONCAT22(auVar6._0_2_ * sVar178,sVar160));
        auVar15._4_8_ = (long)((unkuint10)Var4 >> 0x10);
        auVar15._2_2_ = local_98._2_2_;
        auVar15._0_2_ = auVar5._0_2_ * sVar175;
        iVar53 = CONCAT22(local_a8._6_2_,sVar131);
        Var7 = CONCAT64(CONCAT42(iVar53,local_a8._4_2_),CONCAT22(sVar65 * sVar178,sVar131));
        auVar16._4_8_ = (long)((unkuint10)Var7 >> 0x10);
        auVar16._2_2_ = local_a8._2_2_;
        auVar16._0_2_ = sVar64 * sVar175;
        iVar54 = CONCAT22(local_b8._6_2_,sVar145);
        Var10 = CONCAT64(CONCAT42(iVar54,local_b8._4_2_),CONCAT22(auVar9._0_2_ * sVar178,sVar145));
        auVar17._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar17._2_2_ = local_b8._2_2_;
        auVar17._0_2_ = auVar8._0_2_ * sVar175;
        iVar48 = CONCAT22(auVar193._6_2_,sVar196);
        Var29 = CONCAT64(CONCAT42(iVar48,auVar193._4_2_),CONCAT22(sVar120 * sVar178,sVar196));
        auVar18._4_8_ = (long)((unkuint10)Var29 >> 0x10);
        auVar18._2_2_ = auVar193._2_2_;
        auVar18._0_2_ = sVar119 * sVar175;
        iVar147 = CONCAT22(local_98._8_2_,auVar151._8_2_ * sVar182);
        auVar148._0_8_ = CONCAT26(local_98._10_2_,CONCAT24(auVar153._10_2_ * sVar183,iVar147));
        auVar148._8_2_ = auVar155._12_2_ * sVar184;
        auVar148._10_2_ = local_98._12_2_;
        auVar158._12_2_ = auVar156._14_2_ * sVar185;
        auVar158._0_12_ = auVar148;
        auVar158._14_2_ = local_98._14_2_;
        iVar100 = iVar100 + CONCAT22(local_98._0_2_,auVar150._0_2_ * sVar161) + iVar147;
        iVar111 = iVar111 + auVar15._0_4_ + (int)((ulong)auVar148._0_8_ >> 0x20);
        iVar112 = iVar112 + (int)((unkuint10)Var4 >> 0x10) + auVar148._8_4_;
        iVar113 = iVar113 + iVar51 + auVar158._12_4_;
        iVar51 = CONCAT22(local_a8._8_2_,sVar68 * sVar182);
        auVar125._0_8_ = CONCAT26(local_a8._10_2_,CONCAT24(auVar124._10_2_ * sVar183,iVar51));
        auVar125._8_2_ = auVar127._12_2_ * sVar184;
        auVar125._10_2_ = local_a8._12_2_;
        auVar129._12_2_ = auVar128._14_2_ * sVar185;
        auVar129._0_12_ = auVar125;
        auVar129._14_2_ = local_a8._14_2_;
        auVar117._0_4_ = auVar63._0_4_ + CONCAT22(local_a8._0_2_,sVar123 * sVar161) + iVar51;
        auVar117._4_4_ = auVar63._4_4_ + auVar16._0_4_ + (int)((ulong)auVar125._0_8_ >> 0x20);
        auVar117._8_4_ = auVar63._8_4_ + (int)((unkuint10)Var7 >> 0x10) + auVar125._8_4_;
        auVar117._12_4_ = auVar63._12_4_ + iVar53 + auVar129._12_4_;
        iVar51 = CONCAT22(local_b8._8_2_,auVar136._8_2_ * sVar182);
        auVar133._0_8_ = CONCAT26(local_b8._10_2_,CONCAT24(auVar138._10_2_ * sVar183,iVar51));
        auVar133._8_2_ = auVar140._12_2_ * sVar184;
        auVar133._10_2_ = local_b8._12_2_;
        auVar143._12_2_ = auVar141._14_2_ * sVar185;
        auVar143._0_12_ = auVar133;
        auVar143._14_2_ = local_b8._14_2_;
        iVar72 = iVar72 + CONCAT22(local_b8._0_2_,auVar135._0_2_ * sVar161) + iVar51;
        iVar46 = iVar46 + auVar17._0_4_ + (int)((ulong)auVar133._0_8_ >> 0x20);
        iVar35 = iVar35 + (int)((unkuint10)Var10 >> 0x10) + auVar133._8_4_;
        iVar81 = iVar81 + iVar54 + auVar143._12_4_;
        iVar51 = CONCAT22(auVar193._8_2_,sVar122 * sVar182);
        auVar194._0_8_ = CONCAT26(auVar193._10_2_,CONCAT24(auVar190._10_2_ * sVar183,iVar51));
        auVar194._8_2_ = auVar191._12_2_ * sVar184;
        auVar194._10_2_ = auVar193._12_2_;
        auVar195._12_2_ = auVar192._14_2_ * sVar185;
        auVar195._0_12_ = auVar194;
        auVar195._14_2_ = auVar193._14_2_;
        iVar55 = iVar55 + CONCAT22(auVar193._0_2_,sVar186 * sVar161) + iVar51;
        iVar66 = iVar66 + auVar18._0_4_ + (int)((ulong)auVar194._0_8_ >> 0x20);
        iVar69 = iVar69 + (int)((unkuint10)Var29 >> 0x10) + auVar194._8_4_;
        iVar70 = iVar70 + iVar48 + auVar195._12_4_;
        lVar38 = lVar38 + 0x10;
        local_88 = auVar63;
      }
      auVar101._0_4_ = iVar113 + iVar112 + iVar111 + iVar100;
      auVar101._4_4_ = auVar63._12_4_ + auVar63._8_4_ + auVar63._4_4_ + auVar63._0_4_;
      auVar101._8_4_ = iVar81 + iVar35 + iVar46 + iVar72;
      auVar101._12_4_ = iVar70 + iVar69 + iVar66 + iVar55;
      *(undefined4 *)*pauVar39 =
           local_188._12_4_ + local_188._8_4_ + local_188._4_4_ + local_188._0_4_;
      *(undefined4 *)(*pauVar39 + 4) =
           local_1b8._12_4_ + local_1b8._8_4_ + local_1b8._4_4_ + local_1b8._0_4_;
      *(undefined4 *)(*pauVar39 + 8) =
           local_198._12_4_ + local_198._8_4_ + local_198._4_4_ + local_198._0_4_;
      *(int *)(*pauVar39 + 0xc) = iVar54 + iVar53 + iVar51 + auVar164._0_4_;
      pauVar39[1] = auVar101;
      pauVar39 = pauVar39 + 2;
      uVar43 = (ulong)((uint)uVar43 + 2);
    }
    while( true ) {
      uVar40 = (uint)uVar43;
      if ((int)uVar1 <= (int)uVar40) break;
      Mat::channel(&local_120,&tmp,(uVar40 & 1) + (int)(uVar43 >> 1));
      pvVar32 = local_120.data;
      Mat::~Mat(&local_120);
      Mat::channel(&local_120,kernel,iVar41);
      pauVar45 = (undefined1 (*) [16])local_120.data;
      Mat::~Mat(&local_120);
      iVar37 = 0;
      iVar72 = 0;
      iVar46 = 0;
      iVar35 = 0;
      iVar70 = 0;
      iVar100 = 0;
      iVar111 = 0;
      iVar112 = 0;
      iVar81 = 0;
      iVar55 = 0;
      iVar66 = 0;
      iVar69 = 0;
      iVar113 = 0;
      iVar51 = 0;
      iVar53 = 0;
      iVar54 = 0;
      for (lVar38 = 0; iVar34 != (int)lVar38; lVar38 = lVar38 + 1) {
        uVar43 = *(ulong *)((undefined1 *)pvVar32 + lVar38 * 8);
        cVar173 = (char)(uVar43 >> 8);
        cVar174 = (char)(uVar43 >> 0x10);
        cVar176 = (char)(uVar43 >> 0x18);
        cVar177 = (char)(uVar43 >> 0x20);
        cVar179 = (char)(uVar43 >> 0x28);
        cVar180 = (char)(uVar43 >> 0x30);
        auVar172._8_6_ = 0;
        auVar172._0_8_ = uVar43;
        auVar172[0xe] = (char)(uVar43 >> 0x38);
        auVar172[0xf] = -((long)uVar43 < 0);
        auVar171._14_2_ = auVar172._14_2_;
        auVar171._8_5_ = 0;
        auVar171._0_8_ = uVar43;
        auVar171[0xd] = -(cVar180 < '\0');
        auVar170._13_3_ = auVar171._13_3_;
        auVar170._8_4_ = 0;
        auVar170._0_8_ = uVar43;
        auVar170[0xc] = cVar180;
        auVar169._12_4_ = auVar170._12_4_;
        auVar169._8_3_ = 0;
        auVar169._0_8_ = uVar43;
        auVar169[0xb] = -(cVar179 < '\0');
        auVar168._11_5_ = auVar169._11_5_;
        auVar168._8_2_ = 0;
        auVar168._0_8_ = uVar43;
        auVar168[10] = cVar179;
        auVar90._10_6_ = auVar168._10_6_;
        auVar90[8] = 0;
        auVar90._0_8_ = uVar43;
        auVar90[9] = -(cVar177 < '\0');
        auVar167._9_7_ = auVar90._9_7_;
        auVar167[8] = cVar177;
        auVar167._0_8_ = uVar43;
        Var4 = CONCAT91(CONCAT81(auVar167._8_8_,-(cVar176 < '\0')),cVar176);
        auVar20._2_10_ = Var4;
        auVar20[1] = -(cVar174 < '\0');
        auVar20[0] = cVar174;
        auVar19._2_12_ = auVar20;
        auVar19[1] = -(cVar173 < '\0');
        auVar19[0] = cVar173;
        auVar166._0_2_ = CONCAT11(-((char)uVar43 < '\0'),(char)uVar43);
        auVar166._2_14_ = auVar19;
        auVar63 = *pauVar45;
        auVar90 = pauVar45[1];
        auVar109._0_14_ = auVar63._0_14_;
        auVar109[0xe] = auVar63[7];
        auVar109[0xf] = -(auVar63[7] < '\0');
        auVar108._14_2_ = auVar109._14_2_;
        auVar108._0_13_ = auVar63._0_13_;
        auVar108[0xd] = -(auVar63[6] < '\0');
        auVar107._13_3_ = auVar108._13_3_;
        auVar107._0_12_ = auVar63._0_12_;
        auVar107[0xc] = auVar63[6];
        auVar106._12_4_ = auVar107._12_4_;
        auVar106._0_11_ = auVar63._0_11_;
        auVar106[0xb] = -(auVar63[5] < '\0');
        auVar105._11_5_ = auVar106._11_5_;
        auVar105._0_10_ = auVar63._0_10_;
        auVar105[10] = auVar63[5];
        auVar104._10_6_ = auVar105._10_6_;
        auVar104._0_9_ = auVar63._0_9_;
        auVar104[9] = -(auVar63[4] < '\0');
        auVar103._9_7_ = auVar104._9_7_;
        auVar103._0_8_ = auVar63._0_8_;
        auVar103[8] = auVar63[4];
        Var7 = CONCAT91(CONCAT81(auVar103._8_8_,-(auVar63[3] < '\0')),auVar63[3]);
        auVar22._2_10_ = Var7;
        auVar22[1] = -(auVar63[2] < '\0');
        auVar22[0] = auVar63[2];
        auVar21._2_12_ = auVar22;
        auVar21[1] = -(auVar63[1] < '\0');
        auVar21[0] = auVar63[1];
        auVar102._0_2_ = CONCAT11(-(auVar63[0] < '\0'),auVar63[0]);
        auVar102._2_14_ = auVar21;
        sVar52 = CONCAT11(-(auVar63[8] < '\0'),auVar63[8]);
        uVar73 = CONCAT13(-(auVar63[9] < '\0'),CONCAT12(auVar63[9],sVar52));
        uVar74 = CONCAT15(-(auVar63[10] < '\0'),CONCAT14(auVar63[10],uVar73));
        uVar75 = CONCAT17(-(auVar63[0xb] < '\0'),CONCAT16(auVar63[0xb],uVar74));
        auVar77._0_10_ = CONCAT19(-(auVar63[0xc] < '\0'),CONCAT18(auVar63[0xc],uVar75));
        auVar77[10] = auVar63[0xd];
        auVar77[0xb] = -(auVar63[0xd] < '\0');
        auVar78[0xc] = auVar63[0xe];
        auVar78._0_12_ = auVar77;
        auVar78[0xd] = -(auVar63[0xe] < '\0');
        auVar193[0xe] = auVar63[0xf];
        auVar193._0_14_ = auVar78;
        auVar193[0xf] = -(auVar63[0xf] < '\0');
        auVar197._0_14_ = auVar90._0_14_;
        auVar197[0xe] = auVar90[7];
        auVar197[0xf] = -(auVar90[7] < '\0');
        auVar95._14_2_ = auVar197._14_2_;
        auVar95._0_13_ = auVar90._0_13_;
        auVar95[0xd] = -(auVar90[6] < '\0');
        auVar94._13_3_ = auVar95._13_3_;
        auVar94._0_12_ = auVar90._0_12_;
        auVar94[0xc] = auVar90[6];
        auVar110._12_4_ = auVar94._12_4_;
        auVar110._0_11_ = auVar90._0_11_;
        auVar110[0xb] = -(auVar90[5] < '\0');
        auVar93._11_5_ = auVar110._11_5_;
        auVar93._0_10_ = auVar90._0_10_;
        auVar93[10] = auVar90[5];
        auVar96._10_6_ = auVar93._10_6_;
        auVar96._0_9_ = auVar90._0_9_;
        auVar96[9] = -(auVar90[4] < '\0');
        auVar92._9_7_ = auVar96._9_7_;
        auVar92._0_8_ = auVar90._0_8_;
        auVar92[8] = auVar90[4];
        Var10 = CONCAT91(CONCAT81(auVar92._8_8_,-(auVar90[3] < '\0')),auVar90[3]);
        auVar24._2_10_ = Var10;
        auVar24[1] = -(auVar90[2] < '\0');
        auVar24[0] = auVar90[2];
        auVar23._2_12_ = auVar24;
        auVar23[1] = -(auVar90[1] < '\0');
        auVar23[0] = auVar90[1];
        auVar91._0_2_ = CONCAT11(-(auVar90[0] < '\0'),auVar90[0]);
        auVar91._2_14_ = auVar23;
        sVar145 = CONCAT11(-(auVar90[8] < '\0'),auVar90[8]);
        uVar56 = CONCAT13(-(auVar90[9] < '\0'),CONCAT12(auVar90[9],sVar145));
        uVar57 = CONCAT15(-(auVar90[10] < '\0'),CONCAT14(auVar90[10],uVar56));
        uVar58 = CONCAT17(-(auVar90[0xb] < '\0'),CONCAT16(auVar90[0xb],uVar57));
        auVar60._0_10_ = CONCAT19(-(auVar90[0xc] < '\0'),CONCAT18(auVar90[0xc],uVar58));
        auVar60[10] = auVar90[0xd];
        auVar60[0xb] = -(auVar90[0xd] < '\0');
        auVar61[0xc] = auVar90[0xe];
        auVar61._0_12_ = auVar60;
        auVar61[0xd] = -(auVar90[0xe] < '\0');
        auVar63[0xe] = auVar90[0xf];
        auVar63._0_14_ = auVar61;
        auVar63[0xf] = -(auVar90[0xf] < '\0');
        sVar64 = auVar19._0_2_;
        sVar65 = auVar20._0_2_;
        sVar67 = (short)Var4;
        sVar131 = sVar67 * (short)Var7;
        sVar68 = auVar167._8_2_;
        sVar160 = auVar168._10_2_;
        sVar80 = auVar170._12_2_;
        auVar110 = pmulhw(auVar102,auVar166);
        sVar132 = sVar67 * (short)((ulong)uVar75 >> 0x30);
        auVar197 = pmulhw(auVar193,auVar166);
        sVar146 = sVar67 * (short)Var10;
        auVar96 = pmulhw(auVar91,auVar166);
        sVar67 = sVar67 * (short)((ulong)uVar58 >> 0x30);
        auVar90 = pmulhw(auVar63,auVar166);
        iVar48 = CONCAT22(auVar110._6_2_,sVar131);
        Var4 = CONCAT64(CONCAT42(iVar48,auVar110._4_2_),CONCAT22(sVar65 * auVar22._0_2_,sVar131));
        auVar25._4_8_ = (long)((unkuint10)Var4 >> 0x10);
        auVar25._2_2_ = auVar110._2_2_;
        auVar25._0_2_ = sVar64 * auVar21._0_2_;
        iVar147 = CONCAT22(auVar197._6_2_,sVar132);
        Var7 = CONCAT64(CONCAT42(iVar147,auVar197._4_2_),
                        CONCAT22(sVar65 * (short)((uint6)uVar74 >> 0x20),sVar132));
        auVar26._4_8_ = (long)((unkuint10)Var7 >> 0x10);
        auVar26._2_2_ = auVar197._2_2_;
        auVar26._0_2_ = sVar64 * (short)((uint)uVar73 >> 0x10);
        iVar30 = CONCAT22(auVar96._6_2_,sVar146);
        Var10 = CONCAT64(CONCAT42(iVar30,auVar96._4_2_),CONCAT22(sVar65 * auVar24._0_2_,sVar146));
        auVar27._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar27._2_2_ = auVar96._2_2_;
        auVar27._0_2_ = sVar64 * auVar23._0_2_;
        iVar31 = CONCAT22(auVar90._6_2_,sVar67);
        Var29 = CONCAT64(CONCAT42(iVar31,auVar90._4_2_),
                         CONCAT22(sVar65 * (short)((uint6)uVar57 >> 0x20),sVar67));
        auVar28._4_8_ = (long)((unkuint10)Var29 >> 0x10);
        auVar28._2_2_ = auVar90._2_2_;
        auVar28._0_2_ = sVar64 * (short)((uint)uVar56 >> 0x10);
        iVar71 = CONCAT22(auVar110._8_2_,sVar68 * auVar103._8_2_);
        auVar115._0_8_ = CONCAT26(auVar110._10_2_,CONCAT24(sVar160 * auVar105._10_2_,iVar71));
        auVar115._8_2_ = sVar80 * auVar107._12_2_;
        auVar115._10_2_ = auVar110._12_2_;
        auVar118._12_2_ = auVar171._14_2_ * auVar108._14_2_;
        auVar118._0_12_ = auVar115;
        auVar118._14_2_ = auVar110._14_2_;
        iVar37 = iVar37 + CONCAT22(auVar110._0_2_,auVar166._0_2_ * auVar102._0_2_) + iVar71;
        iVar72 = iVar72 + auVar25._0_4_ + (int)((ulong)auVar115._0_8_ >> 0x20);
        iVar46 = iVar46 + (int)((unkuint10)Var4 >> 0x10) + auVar115._8_4_;
        iVar35 = iVar35 + iVar48 + auVar118._12_4_;
        iVar48 = CONCAT22(auVar197._8_2_,sVar68 * (short)((unkuint10)auVar77._0_10_ >> 0x40));
        auVar126._0_8_ = CONCAT26(auVar197._10_2_,CONCAT24(sVar160 * auVar77._10_2_,iVar48));
        auVar126._8_2_ = sVar80 * auVar78._12_2_;
        auVar126._10_2_ = auVar197._12_2_;
        auVar130._12_2_ = auVar171._14_2_ * auVar193._14_2_;
        auVar130._0_12_ = auVar126;
        auVar130._14_2_ = auVar197._14_2_;
        iVar70 = iVar70 + CONCAT22(auVar197._0_2_,auVar166._0_2_ * sVar52) + iVar48;
        iVar100 = iVar100 + auVar26._0_4_ + (int)((ulong)auVar126._0_8_ >> 0x20);
        iVar111 = iVar111 + (int)((unkuint10)Var7 >> 0x10) + auVar126._8_4_;
        iVar112 = iVar112 + iVar147 + auVar130._12_4_;
        iVar48 = CONCAT22(auVar96._8_2_,sVar68 * auVar92._8_2_);
        auVar134._0_8_ = CONCAT26(auVar96._10_2_,CONCAT24(sVar160 * auVar93._10_2_,iVar48));
        auVar134._8_2_ = sVar80 * auVar94._12_2_;
        auVar134._10_2_ = auVar96._12_2_;
        auVar144._12_2_ = auVar171._14_2_ * auVar95._14_2_;
        auVar144._0_12_ = auVar134;
        auVar144._14_2_ = auVar96._14_2_;
        iVar81 = iVar81 + CONCAT22(auVar96._0_2_,auVar166._0_2_ * auVar91._0_2_) + iVar48;
        iVar55 = iVar55 + auVar27._0_4_ + (int)((ulong)auVar134._0_8_ >> 0x20);
        iVar66 = iVar66 + (int)((unkuint10)Var10 >> 0x10) + auVar134._8_4_;
        iVar69 = iVar69 + iVar30 + auVar144._12_4_;
        iVar48 = CONCAT22(auVar90._8_2_,sVar68 * (short)((unkuint10)auVar60._0_10_ >> 0x40));
        auVar149._0_8_ = CONCAT26(auVar90._10_2_,CONCAT24(sVar160 * auVar60._10_2_,iVar48));
        auVar149._8_2_ = sVar80 * auVar61._12_2_;
        auVar149._10_2_ = auVar90._12_2_;
        auVar159._12_2_ = auVar171._14_2_ * auVar63._14_2_;
        auVar159._0_12_ = auVar149;
        auVar159._14_2_ = auVar90._14_2_;
        iVar113 = iVar113 + CONCAT22(auVar90._0_2_,auVar166._0_2_ * sVar145) + iVar48;
        iVar51 = iVar51 + auVar28._0_4_ + (int)((ulong)auVar149._0_8_ >> 0x20);
        iVar53 = iVar53 + (int)((unkuint10)Var29 >> 0x10) + auVar149._8_4_;
        iVar54 = iVar54 + iVar31 + auVar159._12_4_;
        pauVar45 = pauVar45 + 2;
      }
      *(int *)*pauVar39 = iVar35 + iVar46 + iVar72 + iVar37;
      *(int *)(*pauVar39 + 4) = iVar112 + iVar111 + iVar100 + iVar70;
      *(int *)(*pauVar39 + 8) = iVar69 + iVar66 + iVar55 + iVar81;
      *(int *)(*pauVar39 + 0xc) = iVar54 + iVar53 + iVar51 + iVar113;
      pauVar39 = pauVar39 + 1;
      uVar43 = (ulong)(uVar40 + 1);
    }
  }
  Mat::~Mat(&tmp);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            int64_t* tmpptr = tmp.channel(i / 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
        for (; i + 1 < size; i += 2)
        {
            const signed char* tmpptr = tmp.channel(i / 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));

                tmpptr += 16;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                tmpptr += 8;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}